

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_function_bind(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  undefined8 uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  JSValueUnion JVar6;
  JSValueUnion *pJVar7;
  long lVar8;
  uint uVar9;
  JSRefCountHeader *p;
  JSValueUnion JVar10;
  ulong uVar11;
  double dVar12;
  anon_union_8_2_94730072 u;
  double dVar13;
  JSValue this_obj;
  JSValue JVar14;
  
  JVar10 = this_val.u;
  iVar4 = check_function(ctx,this_val);
  if (iVar4 != 0) {
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  this_obj = JS_NewObjectProtoClass(ctx,ctx->function_proto,0xe);
  JVar6 = this_obj.u;
  if ((int)this_obj.tag == 6) goto LAB_0015340a;
  if ((uint)this_val.tag == 0xffffffff) {
    bVar3 = *(byte *)((long)JVar10.ptr + 5) & 0x10;
  }
  else {
    bVar3 = 0;
  }
  *(byte *)((long)JVar6.ptr + 5) = *(byte *)((long)JVar6.ptr + 5) & 0xef | bVar3;
  iVar4 = 1;
  if (1 < argc) {
    iVar4 = argc;
  }
  uVar9 = iVar4 - 1;
  pJVar7 = (JSValueUnion *)js_malloc(ctx,(ulong)uVar9 * 0x10 + 0x28);
  if (pJVar7 != (JSValueUnion *)0x0) {
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)JVar10.ptr = *JVar10.ptr + 1;
    }
    pJVar7->ptr = (void *)JVar10;
    pJVar7[1] = (JSValueUnion)this_val.tag;
    piVar1 = (int *)(argv->u).ptr;
    JVar10 = (JSValueUnion)argv->tag;
    if (0xfffffff4 < (uint)JVar10.int32) {
      *piVar1 = *piVar1 + 1;
    }
    pJVar7[2].ptr = piVar1;
    pJVar7[3] = JVar10;
    pJVar7[4].int32 = uVar9;
    for (lVar8 = 0; (ulong)uVar9 * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
      piVar1 = *(int **)((long)&argv[1].u + lVar8);
      uVar2 = *(undefined8 *)((long)&argv[1].tag + lVar8);
      if (0xfffffff4 < (uint)uVar2) {
        *piVar1 = *piVar1 + 1;
      }
      *(int **)((long)pJVar7 + lVar8 + 0x28) = piVar1;
      *(undefined8 *)((long)pJVar7 + lVar8 + 0x30) = uVar2;
    }
    *(JSValueUnion **)((long)JVar6.ptr + 0x30) = pJVar7;
    iVar5 = JS_GetOwnProperty(ctx,(JSPropertyDescriptor *)0x0,this_val,0x30);
    if (-1 < iVar5) {
      if (iVar5 == 0) {
LAB_00153374:
        JVar6.float64 = 0.0;
        JVar10.float64 = 0.0;
      }
      else {
        JVar14 = JS_GetPropertyInternal(ctx,this_val,0x30,this_val,0);
        iVar5 = (int)JVar14.tag;
        if (iVar5 == 6) goto LAB_001533fa;
        if (iVar5 == 7) {
          if (NAN(JVar14.u.float64)) {
            dVar13 = 0.0;
          }
          else {
            dVar12 = trunc(JVar14.u.float64);
            dVar13 = 0.0;
            if ((double)(int)uVar9 < dVar12) {
              dVar13 = dVar12 - (double)(int)uVar9;
            }
          }
          uVar11 = (ulong)dVar13 & 0xffffffff;
          JVar10.float64 = dVar13 & 0xffffffff00000000;
          if (dVar13 == (double)(int)dVar13) {
            uVar11 = (ulong)(uint)(int)dVar13;
            JVar10.float64 = 0.0;
          }
          JVar6.float64 = 3.45845952088873e-323;
          if (dVar13 == (double)(int)dVar13) {
            JVar6.float64 = 0.0;
          }
          JVar10.float64 = uVar11 | JVar10.float64;
        }
        else {
          if (iVar5 != 0) {
            JS_FreeValue(ctx,JVar14);
            goto LAB_00153374;
          }
          JVar10._0_4_ = JVar14.u._0_4_ - uVar9;
          JVar6.float64 = 0.0;
          JVar10._4_4_ = 0;
          if (JVar14.u._0_4_ < iVar4) {
            JVar10.float64 = JVar6.float64;
          }
        }
      }
      JVar14.tag = (int64_t)JVar6.ptr;
      JVar14.u.float64 = JVar10.float64;
      JS_DefinePropertyValue(ctx,this_obj,0x30,JVar14,1);
      JVar14 = JS_GetPropertyInternal(ctx,this_val,0x36,this_val,0);
      if ((int)JVar14.tag != -7) {
        if ((int)JVar14.tag == 6) goto LAB_001533fa;
        JS_FreeValue(ctx,JVar14);
        JVar14 = JS_AtomToString(ctx,0x2f);
      }
      JVar14 = JS_ConcatString3(ctx,"bound ",JVar14,"");
      if ((int)JVar14.tag != 6) {
        JS_DefinePropertyValue(ctx,this_obj,0x36,JVar14,1);
        return this_obj;
      }
    }
  }
LAB_001533fa:
  JS_FreeValue(ctx,this_obj);
LAB_0015340a:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_function_bind(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSBoundFunction *bf;
    JSValue func_obj, name1, len_val;
    JSObject *p;
    int arg_count, i, ret;

    if (check_function(ctx, this_val))
        return JS_EXCEPTION;

    func_obj = JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                 JS_CLASS_BOUND_FUNCTION);
    if (JS_IsException(func_obj))
        return JS_EXCEPTION;
    p = JS_VALUE_GET_OBJ(func_obj);
    p->is_constructor = JS_IsConstructor(ctx, this_val);
    arg_count = max_int(0, argc - 1);
    bf = js_malloc(ctx, sizeof(*bf) + arg_count * sizeof(JSValue));
    if (!bf)
        goto exception;
    bf->func_obj = JS_DupValue(ctx, this_val);
    bf->this_val = JS_DupValue(ctx, argv[0]);
    bf->argc = arg_count;
    for(i = 0; i < arg_count; i++) {
        bf->argv[i] = JS_DupValue(ctx, argv[i + 1]);
    }
    p->u.bound_function = bf;

    /* XXX: the spec could be simpler by only using GetOwnProperty */
    ret = JS_GetOwnProperty(ctx, NULL, this_val, JS_ATOM_length);
    if (ret < 0)
        goto exception;
    if (!ret) {
        len_val = JS_NewInt32(ctx, 0);
    } else {
        len_val = JS_GetProperty(ctx, this_val, JS_ATOM_length);
        if (JS_IsException(len_val))
            goto exception;
        if (JS_VALUE_GET_TAG(len_val) == JS_TAG_INT) {
            /* most common case */
            int len1 = JS_VALUE_GET_INT(len_val);
            if (len1 <= arg_count)
                len1 = 0;
            else
                len1 -= arg_count;
            len_val = JS_NewInt32(ctx, len1);
        } else if (JS_VALUE_GET_NORM_TAG(len_val) == JS_TAG_FLOAT64) {
            double d = JS_VALUE_GET_FLOAT64(len_val);
            if (isnan(d)) {
                d = 0.0;
            } else {
                d = trunc(d);
                if (d <= (double)arg_count)
                    d = 0.0;
                else
                    d -= (double)arg_count; /* also converts -0 to +0 */
            }
            len_val = JS_NewFloat64(ctx, d);
        } else {
            JS_FreeValue(ctx, len_val);
            len_val = JS_NewInt32(ctx, 0);
        }
    }
    JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_length,
                           len_val, JS_PROP_CONFIGURABLE);

    name1 = JS_GetProperty(ctx, this_val, JS_ATOM_name);
    if (JS_IsException(name1))
        goto exception;
    if (!JS_IsString(name1)) {
        JS_FreeValue(ctx, name1);
        name1 = JS_AtomToString(ctx, JS_ATOM_empty_string);
    }
    name1 = JS_ConcatString3(ctx, "bound ", name1, "");
    if (JS_IsException(name1))
        goto exception;
    JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_name, name1,
                           JS_PROP_CONFIGURABLE);
    return func_obj;
 exception:
    JS_FreeValue(ctx, func_obj);
    return JS_EXCEPTION;
}